

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

Vec_Int_t * Str_ManCreateRoots(Vec_Wec_t *vGroups,int nObjs)

{
  int i;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int i_00;
  int i_01;
  
  p = Vec_IntAlloc(nObjs);
  p->nSize = nObjs;
  memset(p->pArray,0xff,(long)nObjs << 2);
  for (i_00 = 0; i_00 < vGroups->nSize; i_00 = i_00 + 1) {
    p_00 = Vec_WecEntry(vGroups,i_00);
    for (i_01 = 0; i_01 < p_00->nSize; i_01 = i_01 + 1) {
      i = Vec_IntEntry(p_00,i_01);
      Vec_IntWriteEntry(p,i,i_00);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Str_ManCreateRoots( Vec_Wec_t * vGroups, int nObjs )
{   // map tree MUXes into their classes
    Vec_Int_t * vRoots;
    Vec_Int_t * vGroup;
    int i, k, Entry;
    vRoots = Vec_IntStartFull( nObjs );
    Vec_WecForEachLevel( vGroups, vGroup, i )
        Vec_IntForEachEntry( vGroup, Entry, k )
            Vec_IntWriteEntry( vRoots, Entry, i );
    return vRoots;
}